

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

Vec_Str_t * Gia_ManToBridgeVec(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint x;
  Gia_Obj_t *pGVar3;
  Vec_Str_t *vStr_00;
  bool bVar4;
  int local_30;
  int nNodes;
  int uLit1;
  int uLit0;
  int i;
  Gia_Obj_t *pObj;
  Vec_Str_t *vStr;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilBridge.c"
                  ,0x47,"Vec_Str_t *Gia_ManToBridgeVec(Gia_Man_t *)");
  }
  uVar2 = Abc_Var2Lit(1,1);
  pGVar3 = Gia_ManConst0(p);
  pGVar3->Value = uVar2;
  uLit1 = 0;
  local_30 = 2;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar4 = false;
    if (uLit1 < iVar1) {
      _uLit0 = Gia_ManCi(p,uLit1);
      bVar4 = _uLit0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    uVar2 = Abc_Var2Lit(local_30,0);
    _uLit0->Value = uVar2;
    uLit1 = uLit1 + 1;
    local_30 = local_30 + 1;
  }
  uLit1 = 0;
  while( true ) {
    bVar4 = false;
    if (uLit1 < p->nObjs) {
      _uLit0 = Gia_ManObj(p,uLit1);
      bVar4 = _uLit0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(_uLit0);
    if (iVar1 != 0) {
      uVar2 = Abc_Var2Lit(local_30,0);
      _uLit0->Value = uVar2;
      local_30 = local_30 + 1;
    }
    uLit1 = uLit1 + 1;
  }
  vStr_00 = Vec_StrAlloc(1000);
  uVar2 = Gia_ManPiNum(p);
  Gia_AigerWriteUnsigned(vStr_00,uVar2);
  uVar2 = Gia_ManRegNum(p);
  Gia_AigerWriteUnsigned(vStr_00,uVar2);
  uVar2 = Gia_ManAndNum(p);
  Gia_AigerWriteUnsigned(vStr_00,uVar2);
  uLit1 = 0;
  while( true ) {
    bVar4 = false;
    if (uLit1 < p->nObjs) {
      _uLit0 = Gia_ManObj(p,uLit1);
      bVar4 = _uLit0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(_uLit0);
    if (iVar1 != 0) {
      uVar2 = Gia_ObjFanin0Copy(_uLit0);
      x = Gia_ObjFanin1Copy(_uLit0);
      if (uVar2 == x) {
        __assert_fail("uLit0 != uLit1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilBridge.c"
                      ,0x5d,"Vec_Str_t *Gia_ManToBridgeVec(Gia_Man_t *)");
      }
      Gia_AigerWriteUnsigned(vStr_00,uVar2 << 1);
      Gia_AigerWriteUnsigned(vStr_00,x);
    }
    uLit1 = uLit1 + 1;
  }
  uLit1 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar4 = false;
    if (uLit1 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      _uLit0 = Gia_ManCo(p,iVar1 + uLit1);
      bVar4 = _uLit0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjFanin0Copy(_uLit0);
    Gia_AigerWriteUnsigned(vStr_00,iVar1 << 2 | 2);
    uLit1 = uLit1 + 1;
  }
  uVar2 = Gia_ManPoNum(p);
  Gia_AigerWriteUnsigned(vStr_00,uVar2);
  uLit1 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar4 = false;
    if (uLit1 < iVar1) {
      _uLit0 = Gia_ManCo(p,uLit1);
      bVar4 = _uLit0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjFanin0Copy(_uLit0);
    uVar2 = Abc_LitNot(iVar1);
    Gia_AigerWriteUnsigned(vStr_00,uVar2);
    uLit1 = uLit1 + 1;
  }
  return vStr_00;
}

Assistant:

Vec_Str_t * Gia_ManToBridgeVec( Gia_Man_t * p )
{
    Vec_Str_t * vStr;
    Gia_Obj_t * pObj;
    int i, uLit0, uLit1, nNodes;
    assert( Gia_ManPoNum(p) > 0 );

    // start with const1 node (number 1)
    nNodes = 1;
    // assign literals(!!!) to the value field
    Gia_ManConst0(p)->Value = Abc_Var2Lit( nNodes++, 1 );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Abc_Var2Lit( nNodes++, 0 );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Abc_Var2Lit( nNodes++, 0 );

    // write header
    vStr = Vec_StrAlloc( 1000 );
    Gia_AigerWriteUnsigned( vStr, Gia_ManPiNum(p) );
    Gia_AigerWriteUnsigned( vStr, Gia_ManRegNum(p) );
    Gia_AigerWriteUnsigned( vStr, Gia_ManAndNum(p) );

    // write the nodes 
    Gia_ManForEachAnd( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        uLit1 = Gia_ObjFanin1Copy( pObj );
        assert( uLit0 != uLit1 );
        Gia_AigerWriteUnsigned( vStr, uLit0 << 1 );
        Gia_AigerWriteUnsigned( vStr, uLit1 );
    }

    // write latch drivers
    Gia_ManForEachRi( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        Gia_AigerWriteUnsigned( vStr, (uLit0 << 2) | BRIDGE_VALUE_0 );
    }

    // write PO drivers
    Gia_AigerWriteUnsigned( vStr, Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        // complement property output!!!
        Gia_AigerWriteUnsigned( vStr, Abc_LitNot(uLit0) );
    }
    return vStr;
}